

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall arangodb::velocypack::Options::Options(Options *this)

{
  uint uVar1;
  undefined4 *in_RDI;
  
  *in_RDI = 2;
  in_RDI[1] = 2;
  *(undefined8 *)(in_RDI + 2) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined1 *)(in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 0x19) = 0;
  *(undefined1 *)((long)in_RDI + 0x1a) = 0;
  *(undefined1 *)((long)in_RDI + 0x1b) = 0;
  *(undefined1 *)(in_RDI + 7) = 0;
  *(undefined1 *)((long)in_RDI + 0x1d) = 1;
  *(undefined1 *)((long)in_RDI + 0x1e) = 0;
  *(undefined1 *)((long)in_RDI + 0x1f) = 0;
  *(undefined1 *)(in_RDI + 8) = 0;
  *(undefined1 *)((long)in_RDI + 0x21) = 1;
  *(undefined1 *)((long)in_RDI + 0x22) = 0;
  *(undefined1 *)((long)in_RDI + 0x23) = 1;
  *(undefined1 *)(in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 0x25) = 0;
  *(undefined1 *)((long)in_RDI + 0x26) = 0;
  *(undefined1 *)((long)in_RDI + 0x27) = 0;
  *(undefined1 *)(in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0x29) = 0;
  *(undefined1 *)((long)in_RDI + 0x2a) = 0;
  *(undefined1 *)((long)in_RDI + 0x2b) = 0;
  uVar1 = std::numeric_limits<unsigned_int>::max();
  in_RDI[0xb] = uVar1;
  return;
}

Assistant:

Options() {}